

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_polar_codes.cpp
# Opt level: O1

bool lzham::generate_polar_codes
               (void *pContext,uint num_syms,uint16 *pFreq,uint8 *pCodesizes,uint *max_code_size,
               uint *total_freq_ret)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  ushort *puVar6;
  long lVar7;
  undefined1 *puVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  sym_freq_conflict *pSF;
  long lVar12;
  uint uVar13;
  sym_freq_conflict *psVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  uint hist [512];
  uint auStack_c38 [256];
  int local_838;
  undefined1 local_834 [1020];
  uint local_438 [258];
  
  if (num_syms - 1 < 600) {
    if (num_syms == 0) {
      uVar15 = 0;
      uVar13 = 0;
    }
    else {
      uVar11 = 0;
      uVar13 = 0;
      uVar16 = 0;
      do {
        uVar2 = pFreq[uVar11];
        if (uVar2 == 0) {
          pCodesizes[uVar11] = '\0';
        }
        else {
          uVar13 = uVar13 + uVar2;
          *(short *)((long)pContext + uVar16 * 4 + 2) = (short)uVar11;
          *(ushort *)((long)pContext + uVar16 * 4) = uVar2;
          uVar16 = (ulong)((int)uVar16 + 1);
        }
        uVar15 = (uint)uVar16;
        uVar11 = uVar11 + 1;
      } while (num_syms != uVar11);
    }
    *total_freq_ret = uVar13;
    if (uVar15 == 1) {
      pCodesizes[*(ushort *)((long)pContext + 2)] = '\x01';
    }
    else {
      memset(&local_838,0,0x800);
      uVar5 = uVar15 & 0xfffffffe;
      puVar6 = (ushort *)pContext;
      if (uVar5 != 0) {
        do {
          uVar2 = *puVar6;
          uVar3 = puVar6[2];
          (&local_838)[uVar2 & 0xff] = (&local_838)[uVar2 & 0xff] + 1;
          piVar1 = (int *)((long)local_438 + (ulong)(uVar2 >> 6 & 0xfffffffc));
          *piVar1 = *piVar1 + 1;
          (&local_838)[uVar3 & 0xff] = (&local_838)[uVar3 & 0xff] + 1;
          piVar1 = (int *)((long)local_438 + (ulong)(uVar3 >> 6 & 0xfffffffc));
          *piVar1 = *piVar1 + 1;
          puVar6 = puVar6 + 4;
        } while (puVar6 != (ushort *)((long)pContext + (ulong)uVar5 * 4));
      }
      if ((uVar15 & 1) != 0) {
        uVar2 = *puVar6;
        (&local_838)[(byte)uVar2] = (&local_838)[(byte)uVar2] + 1;
        piVar1 = (int *)((long)local_438 + (ulong)(uVar2 >> 6 & 0xfffffffc));
        *piVar1 = *piVar1 + 1;
      }
      puVar8 = local_834;
      psVar14 = (sym_freq_conflict *)((long)pContext + 0x960);
      lVar12 = 0;
      do {
        pSF = psVar14;
        uVar11 = 0xfffffffffffffffe;
        uVar9 = 0;
        do {
          auStack_c38[uVar11 + 2] = uVar9;
          iVar4 = *(int *)(puVar8 + uVar11 * 4 + 4);
          auStack_c38[uVar11 + 3] = uVar9 + iVar4;
          uVar9 = uVar9 + iVar4 + *(int *)(puVar8 + uVar11 * 4 + 8);
          uVar11 = uVar11 + 2;
        } while (uVar11 < 0xfe);
        lVar7 = (ulong)(uVar15 & 0xfffffffe) << 2;
        psVar14 = (sym_freq_conflict *)pContext;
        if (uVar5 != 0) {
          do {
            uVar2 = psVar14->m_freq >> 8;
            if (lVar12 == 0) {
              uVar2 = psVar14->m_freq;
            }
            uVar3 = psVar14[1].m_freq >> 8;
            if (lVar12 == 0) {
              uVar3 = psVar14[1].m_freq;
            }
            uVar10 = uVar2 & 0xff;
            uVar17 = uVar3 & 0xff;
            uVar9 = auStack_c38[uVar10];
            if (uVar10 == uVar17) {
              auStack_c38[uVar10] = uVar9 + 2;
              pSF[uVar9] = *psVar14;
              uVar10 = uVar9 + 1;
            }
            else {
              auStack_c38[uVar10] = uVar9 + 1;
              uVar10 = auStack_c38[uVar17];
              auStack_c38[uVar17] = uVar10 + 1;
              pSF[uVar9] = *psVar14;
            }
            pSF[uVar10] = psVar14[1];
            psVar14 = psVar14 + 2;
            lVar7 = lVar7 + -8;
          } while (lVar7 != 0);
        }
        if ((uVar15 & 1) != 0) {
          uVar10 = psVar14->m_freq >> ((char)lVar12 * '\b' & 0x1fU) & 0xff;
          uVar9 = auStack_c38[uVar10];
          auStack_c38[uVar10] = uVar9 + 1;
          pSF[uVar9] = *psVar14;
        }
        if (local_438[0] == uVar15) break;
        puVar8 = puVar8 + 0x400;
        bVar18 = lVar12 == 0;
        psVar14 = (sym_freq_conflict *)pContext;
        lVar12 = lVar12 + 1;
        pContext = pSF;
      } while (bVar18);
      generate_polar_codes(num_syms,pSF,pCodesizes,max_code_size);
    }
  }
  return num_syms - 1 < 600;
}

Assistant:

bool generate_polar_codes(void* pContext, uint num_syms, const uint16* pFreq, uint8* pCodesizes, uint& max_code_size, uint& total_freq_ret)
   {
      if ((!num_syms) || (num_syms > cPolarMaxSupportedSyms))
         return false;

      polar_work_tables& state = *static_cast<polar_work_tables*>(pContext);;

      uint max_freq = 0;
      uint total_freq = 0;

      uint num_used_syms = 0;
      for (uint i = 0; i < num_syms; i++)
      {
         uint freq = pFreq[i];

         if (!freq)
            pCodesizes[i] = 0;
         else
         {
            total_freq += freq;
            max_freq = math::maximum(max_freq, freq);

            sym_freq& sf = state.syms0[num_used_syms];
            sf.m_sym = static_cast<uint16>(i);
            sf.m_freq = static_cast<uint16>(freq);
            num_used_syms++;
         }            
      }

      total_freq_ret = total_freq;

      if (num_used_syms == 1)
      {
         pCodesizes[state.syms0[0].m_sym] = 1;
      }
      else
      {
         sym_freq* syms = radix_sort_syms(num_used_syms, state.syms0, state.syms1);
         
#if LZHAM_USE_SHANNON_FANO_CODES
         generate_shannon_fano_codes(num_syms, syms, total_freq, pCodesizes, max_code_size);
#elif LZHAM_USE_FYFFE_CODES         
         generate_fyffe_codes(num_syms, syms, pCodesizes, max_code_size);
#else
         generate_polar_codes(num_syms, syms, pCodesizes, max_code_size);
#endif         
      }

      return true;
   }